

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::Parse3CachedRE2(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  int iVar2;
  StringPiece sp3;
  StringPiece sp2;
  StringPiece sp1;
  RE2 re;
  StringPiece *local_2d0;
  StringPiece *local_2c8;
  StringPiece local_2c0;
  StringPiece local_2b0;
  undefined8 local_2a0;
  undefined4 local_298;
  undefined8 *local_290;
  ostream local_288 [376];
  RE2 local_110;
  
  RE2::RE2(&local_110,regexp);
  iVar2 = std::__cxx11::string::compare((char *)local_110.error_);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x49d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_288,"Check failed: (re.error()) == (\"\")",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
  }
  local_2a0 = 0;
  local_298 = 0;
  local_2b0.ptr_ = (char *)0x0;
  local_2b0.length_ = 0;
  local_2c0.ptr_ = (char *)0x0;
  local_2c0.length_ = 0;
  if (0 < iters) {
    do {
      local_290 = &local_2a0;
      local_2c8 = &local_2b0;
      local_2d0 = &local_2c0;
      bVar1 = RE2::FullMatch<re2::StringPiece*,re2::StringPiece*,re2::StringPiece*>
                        (text,&local_110,(StringPiece **)&local_290,&local_2c8,&local_2d0);
      if (!bVar1) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x4a0,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_288,"Check failed: RE2::FullMatch(text, re, &sp1, &sp2, &sp3)",0x38);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
      }
      iters = iters + -1;
    } while (iters != 0);
  }
  RE2::~RE2(&local_110);
  return;
}

Assistant:

void Parse3CachedRE2(int iters, const char* regexp, const StringPiece& text) {
  RE2 re(regexp);
  CHECK_EQ(re.error(), "");
  StringPiece sp1, sp2, sp3;
  for (int i = 0; i < iters; i++) {
    CHECK(RE2::FullMatch(text, re, &sp1, &sp2, &sp3));
  }
}